

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcsstr(char16_t *string,char16_t *strCharSet)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (strCharSet != (char16_t *)0x0 && string != (char16_t *)0x0) {
    if (*strCharSet == L'\0') {
      return string;
    }
    for (; *string != L'\0'; string = string + 1) {
      iVar1 = 0;
      do {
        lVar2 = (long)iVar1;
        if (strCharSet[lVar2] == L'\0') {
          return string;
        }
        lVar3 = (long)iVar1;
        if (string[lVar3] == L'\0') {
          return (char16_t *)0x0;
        }
        iVar1 = iVar1 + 1;
      } while (string[lVar3] == strCharSet[lVar2]);
    }
  }
  return (char16_t *)0x0;
}

Assistant:

const char16_t *
__cdecl
PAL_wcsstr(
        const char16_t *string,
        const char16_t *strCharSet)
{
    char16_t *ret = NULL;
    int i;

    PERF_ENTRY(wcsstr);
    ENTRY("wcsstr (string=%p (%S), strCharSet=%p (%S))\n",
      string?string:W16_NULLSTRING,
      string?string:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING);

    if (string == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (strCharSet == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (*strCharSet == 0)
    {
        ret = (char16_t *)string;
        goto leave;
    }

    while (*string != 0)
    {
        i = 0;
        while (1)
        {
            if (*(strCharSet + i) == 0)
            {
                ret = (char16_t *) string;
                goto leave;
            }
            else if (*(string + i) == 0)
            {
                ret = NULL;
                goto leave;
            }
            if (*(string + i) != *(strCharSet + i))
            {
                break;
            }

            i++;
        }
        string++;
    }

 leave:
    LOGEXIT("wcsstr returning char16_t %p (%S)\n", ret?ret:W16_NULLSTRING, ret?ret:W16_NULLSTRING);
    PERF_EXIT(wcsstr);
    return ret;
}